

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O1

void __thiscall JsrtDebugStackFrames::ClearFrameDictionary(JsrtDebugStackFrames *this)

{
  int iVar1;
  FramesDictionary *pFVar2;
  JsrtDebuggerStackFrame *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  ulong uVar3;
  int iVar4;
  
  pFVar2 = this->framesDictionary;
  if (pFVar2 != (FramesDictionary *)0x0) {
    if (pFVar2->bucketCount != 0) {
      uVar3 = 0;
      do {
        iVar4 = pFVar2->buckets[uVar3];
        while (iVar4 != -1) {
          iVar1 = pFVar2->entries[iVar4].
                  super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_JsrtDebuggerStackFrame_*>.
                  super_ValueEntry<JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>.next;
          this_00 = pFVar2->entries[iVar4].
                    super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_int,_JsrtDebuggerStackFrame_*>.
                    super_ValueEntry<JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>_>
                    .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>.value;
          this_01 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          JsrtDebuggerStackFrame::~JsrtDebuggerStackFrame(this_00);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (this_01,this_00,0x18);
          iVar4 = iVar1;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < pFVar2->bucketCount);
    }
    JsUtil::
    BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Clear(this->framesDictionary);
    return;
  }
  return;
}

Assistant:

void JsrtDebugStackFrames::ClearFrameDictionary()
{
    if (this->framesDictionary != nullptr)
    {
        this->framesDictionary->Map([this](uint handle, JsrtDebuggerStackFrame* debuggerStackFrame) {
            Adelete(this->jsrtDebugManager->GetDebugObjectArena(), debuggerStackFrame);
        });
        this->framesDictionary->Clear();
    }
}